

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O2

int lj_cf_debug_getuservalue(lua_State *L)

{
  TValue *pTVar1;
  
  pTVar1 = L->base;
  if ((pTVar1 < L->top) && ((pTVar1->field_2).it == 0xfffffff3)) {
    (pTVar1->field_2).field_0 =
         *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
          ((ulong)(pTVar1->u32).lo + 8);
    (pTVar1->field_2).it = 0xfffffff4;
  }
  else {
    (pTVar1->field_2).it = 0xffffffff;
  }
  L->top = pTVar1 + 1;
  return 1;
}

Assistant:

LJLIB_CF(debug_getuservalue)
{
  TValue *o = L->base;
  if (o < L->top && tvisudata(o))
    settabV(L, o, tabref(udataV(o)->env));
  else
    setnilV(o);
  L->top = o+1;
  return 1;
}